

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O0

Fl_Color shade_color(uchar gc,Fl_Color bc)

{
  Fl_Color FVar1;
  Fl_Color bc_local;
  uchar gc_local;
  
  FVar1 = fl_color_average((uint)gc,bc,0.75);
  return FVar1;
}

Assistant:

inline Fl_Color shade_color(uchar gc, Fl_Color bc) {
#ifdef USE_OLD_PLASTIC_COLOR
  return fl_color_average((Fl_Color)gc, bc, 0.75f);
#else
  unsigned	grgb = Fl::get_color((Fl_Color)gc),
		brgb = Fl::get_color(bc);
  int		red, green, blue, gray;


  gray  = ((grgb >> 24) & 255);
  red   = gray * ((brgb >> 24) & 255) / 255 + gray * gray / 510;
  gray  = ((grgb >> 16) & 255);
  green = gray * ((brgb >> 16) & 255) / 255 + gray * gray / 510;
  gray  = ((grgb >> 8) & 255);
  blue  = gray * ((brgb >> 8) & 255) / 255 + gray * gray / 510;

  if (red > 255)
    red = 255;

  if (green > 255)
    green = 255;

  if (blue > 255)
    blue = 255;

  if (Fl::draw_box_active())
    return fl_rgb_color(red, green, blue);
  else
    return fl_color_average(FL_GRAY, fl_rgb_color(red, green, blue), 0.75f);
#endif // USE_OLD_PLASTIC_COLOR
}